

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5UpdateMethod(sqlite3_vtab *pVtab,int nArg,sqlite3_value **apVal,sqlite_int64 *pRowid)

{
  long lVar1;
  Fts5Config *pFVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Fts5Storage *pFVar7;
  Fts5FullTable *apVal_00;
  Fts5FullTable *pTab_00;
  undefined8 *in_RDX;
  int in_ESI;
  Fts5FullTable *in_RDI;
  long in_FS_OFFSET;
  i64 iNew_1;
  i64 iOld;
  Fts5Storage *pStorage;
  i64 iNew;
  sqlite3_value *pVal;
  int ii;
  int eType1;
  i64 iDel;
  int eConflict;
  char *z;
  int eType0;
  Fts5Config *pConfig;
  Fts5FullTable *pTab;
  int bContent;
  int rc;
  i64 *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  Fts5FullTable *in_stack_ffffffffffffff68;
  Fts5Config *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  Fts5Config *in_stack_ffffffffffffff80;
  Fts5Config *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  sqlite3_value **in_stack_ffffffffffffff98;
  Fts5Storage *in_stack_ffffffffffffffa8;
  int local_14;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar2 = (in_RDI->p).pConfig;
  local_c = 0;
  if ((pFVar2->pgsz != 0) ||
     (local_14 = sqlite3Fts5ConfigLoad
                           (in_stack_ffffffffffffff88,
                            (int)((ulong)in_stack_ffffffffffffff80 >> 0x20)), local_c = local_14,
     local_14 == 0)) {
    ((in_RDI->p).pConfig)->pzErrmsg = &(in_RDI->p).base.zErrMsg;
    fts5TripCursors(in_RDI);
    iVar3 = sqlite3_value_type((sqlite3_value *)*in_RDX);
    if ((iVar3 == 5) &&
       (iVar4 = sqlite3_value_type((sqlite3_value *)in_RDX[pFVar2->nCol + 2]), iVar4 != 5)) {
      sqlite3_value_text((sqlite3_value *)0x2643f4);
      if ((pFVar2->eContent == 0) ||
         (iVar3 = sqlite3_stricmp((char *)in_stack_ffffffffffffff58,(char *)0x264415), iVar3 != 0))
      {
        local_c = fts5SpecialInsert((Fts5FullTable *)in_stack_ffffffffffffff80,
                                    in_stack_ffffffffffffff78,
                                    (sqlite3_value *)in_stack_ffffffffffffff70);
      }
      else if (pFVar2->bContentlessDelete == 0) {
        local_c = fts5SpecialDelete((Fts5FullTable *)in_stack_ffffffffffffff70,
                                    (sqlite3_value **)in_stack_ffffffffffffff68);
      }
      else {
        fts5SetVtabError(in_RDI,"\'delete\' may not be used with a contentless_delete=1 table");
        local_c = 1;
      }
    }
    else {
      iVar4 = 4;
      if ((pFVar2->eContent == 0) || (pFVar2->bContentlessDelete != 0)) {
        iVar4 = sqlite3_vtab_on_conflict(pFVar2->db);
      }
      if (in_ESI == 1) {
        iVar3 = fts5IsContentless(in_RDI,1);
        iVar4 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
        if ((iVar3 == 0) || (pFVar2->bContentlessDelete != 0)) {
          sqlite3_value_int64((sqlite3_value *)0x264523);
          local_c = sqlite3Fts5StorageDelete
                              ((Fts5Storage *)in_stack_ffffffffffffff80,
                               (i64)in_stack_ffffffffffffff78,
                               (sqlite3_value **)in_stack_ffffffffffffff70,iVar4);
        }
        else {
          fts5SetVtabError(in_RDI,"cannot DELETE from contentless fts5 table: %s",pFVar2->zName);
          local_c = 1;
        }
      }
      else {
        iVar5 = sqlite3_value_numeric_type
                          ((sqlite3_value *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        if (pFVar2->bLocale == 0) {
          for (in_stack_ffffffffffffff90 = 0; in_stack_ffffffffffffff90 < pFVar2->nCol;
              in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + 1) {
            iVar6 = sqlite3Fts5IsLocaleValue
                              (in_stack_ffffffffffffff70,(sqlite3_value *)in_stack_ffffffffffffff68)
            ;
            if (iVar6 != 0) {
              fts5SetVtabError(in_RDI,"fts5_locale() requires locale=1");
              local_c = 0x14;
              goto LAB_002648a9;
            }
          }
        }
        if (iVar3 == 1) {
          pFVar7 = in_RDI->pStorage;
          apVal_00 = (Fts5FullTable *)sqlite3_value_int64((sqlite3_value *)0x26466c);
          pTab_00 = (Fts5FullTable *)sqlite3_value_int64((sqlite3_value *)0x26467f);
          iVar3 = fts5IsContentless(in_RDI,1);
          if ((iVar3 == 0) ||
             (local_c = fts5ContentlessUpdate
                                  (in_stack_ffffffffffffff80,(sqlite3_value **)pFVar7,
                                   (int)((ulong)apVal_00 >> 0x20),(int *)pTab_00), local_c == 0)) {
            if (iVar5 == 1) {
              iVar3 = (int)((ulong)pTab_00 >> 0x20);
              if (apVal_00 == pTab_00) {
                local_c = sqlite3Fts5StorageDelete
                                    ((Fts5Storage *)in_stack_ffffffffffffff80,(i64)pFVar7,
                                     (sqlite3_value **)apVal_00,iVar3);
                fts5StorageInsert((int *)apVal_00,pTab_00,
                                  (sqlite3_value **)
                                  CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                  in_stack_ffffffffffffff58);
              }
              else if (iVar4 == 5) {
                local_c = sqlite3Fts5StorageDelete
                                    ((Fts5Storage *)in_stack_ffffffffffffff80,(i64)pFVar7,
                                     (sqlite3_value **)apVal_00,iVar3);
                if (local_c == 0) {
                  local_c = sqlite3Fts5StorageDelete
                                      ((Fts5Storage *)in_stack_ffffffffffffff80,(i64)pFVar7,
                                       (sqlite3_value **)apVal_00,(int)((ulong)pTab_00 >> 0x20));
                }
                fts5StorageInsert((int *)apVal_00,pTab_00,
                                  (sqlite3_value **)
                                  CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                  in_stack_ffffffffffffff58);
              }
              else {
                local_c = sqlite3Fts5StorageFindDeleteRow
                                    ((Fts5Storage *)
                                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                     (i64)in_stack_ffffffffffffff58);
                iVar3 = (int)((ulong)pTab_00 >> 0x20);
                if (local_c == 0) {
                  local_c = sqlite3Fts5StorageContentInsert
                                      (in_stack_ffffffffffffffa8,iVar4,in_stack_ffffffffffffff98,
                                       (i64 *)CONCAT44(iVar5,in_stack_ffffffffffffff90));
                }
                if (local_c == 0) {
                  local_c = sqlite3Fts5StorageDelete
                                      ((Fts5Storage *)in_stack_ffffffffffffff80,(i64)pFVar7,
                                       (sqlite3_value **)apVal_00,iVar3);
                }
                if (local_c == 0) {
                  local_c = sqlite3Fts5StorageIndexInsert
                                      ((Fts5Storage *)in_stack_ffffffffffffff80,
                                       (sqlite3_value **)pFVar7,(i64)apVal_00);
                }
              }
            }
            else {
              local_c = 0x14;
            }
            sqlite3Fts5StorageReleaseDeleteRow((Fts5Storage *)0x2648a3);
          }
        }
        else {
          if ((iVar4 == 5) && (iVar5 == 1)) {
            pFVar7 = (Fts5Storage *)sqlite3_value_int64((sqlite3_value *)0x26460b);
            local_c = sqlite3Fts5StorageDelete
                                (pFVar7,(i64)in_stack_ffffffffffffff78,
                                 (sqlite3_value **)in_stack_ffffffffffffff70,
                                 (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
          }
          fts5StorageInsert((int *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                            (sqlite3_value **)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            in_stack_ffffffffffffff58);
        }
      }
    }
LAB_002648a9:
    ((in_RDI->p).pConfig)->pzErrmsg = (char **)0x0;
    local_14 = local_c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5UpdateMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  int nArg,                       /* Size of argument array */
  sqlite3_value **apVal,          /* Array of arguments */
  sqlite_int64 *pRowid            /* OUT: The affected (or effected) rowid */
){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  Fts5Config *pConfig = pTab->p.pConfig;
  int eType0;                     /* value_type() of apVal[0] */
  int rc = SQLITE_OK;             /* Return code */

  /* A transaction must be open when this is called. */
  assert( pTab->ts.eState==1 || pTab->ts.eState==2 );

  assert( pVtab->zErrMsg==0 );
  assert( nArg==1 || nArg==(2+pConfig->nCol+2) );
  assert( sqlite3_value_type(apVal[0])==SQLITE_INTEGER
       || sqlite3_value_type(apVal[0])==SQLITE_NULL
  );
  assert( pTab->p.pConfig->pzErrmsg==0 );
  if( pConfig->pgsz==0 ){
    rc = sqlite3Fts5ConfigLoad(pTab->p.pConfig, pTab->p.pConfig->iCookie);
    if( rc!=SQLITE_OK ) return rc;
  }

  pTab->p.pConfig->pzErrmsg = &pTab->p.base.zErrMsg;

  /* Put any active cursors into REQUIRE_SEEK state. */
  fts5TripCursors(pTab);

  eType0 = sqlite3_value_type(apVal[0]);
  if( eType0==SQLITE_NULL
   && sqlite3_value_type(apVal[2+pConfig->nCol])!=SQLITE_NULL
  ){
    /* A "special" INSERT op. These are handled separately. */
    const char *z = (const char*)sqlite3_value_text(apVal[2+pConfig->nCol]);
    if( pConfig->eContent!=FTS5_CONTENT_NORMAL
      && 0==sqlite3_stricmp("delete", z)
    ){
      if( pConfig->bContentlessDelete ){
        fts5SetVtabError(pTab,
            "'delete' may not be used with a contentless_delete=1 table"
        );
        rc = SQLITE_ERROR;
      }else{
        rc = fts5SpecialDelete(pTab, apVal);
      }
    }else{
      rc = fts5SpecialInsert(pTab, z, apVal[2 + pConfig->nCol + 1]);
    }
  }else{
    /* A regular INSERT, UPDATE or DELETE statement. The trick here is that
    ** any conflict on the rowid value must be detected before any
    ** modifications are made to the database file. There are 4 cases:
    **
    **   1) DELETE
    **   2) UPDATE (rowid not modified)
    **   3) UPDATE (rowid modified)
    **   4) INSERT
    **
    ** Cases 3 and 4 may violate the rowid constraint.
    */
    int eConflict = SQLITE_ABORT;
    if( pConfig->eContent==FTS5_CONTENT_NORMAL || pConfig->bContentlessDelete ){
      eConflict = sqlite3_vtab_on_conflict(pConfig->db);
    }

    assert( eType0==SQLITE_INTEGER || eType0==SQLITE_NULL );
    assert( nArg!=1 || eType0==SQLITE_INTEGER );

    /* DELETE */
    if( nArg==1 ){
      /* It is only possible to DELETE from a contentless table if the
      ** contentless_delete=1 flag is set. */
      if( fts5IsContentless(pTab, 1) && pConfig->bContentlessDelete==0 ){
        fts5SetVtabError(pTab,
            "cannot DELETE from contentless fts5 table: %s", pConfig->zName
        );
        rc = SQLITE_ERROR;
      }else{
        i64 iDel = sqlite3_value_int64(apVal[0]);  /* Rowid to delete */
        rc = sqlite3Fts5StorageDelete(pTab->pStorage, iDel, 0, 0);
      }
    }

    /* INSERT or UPDATE */
    else{
      int eType1 = sqlite3_value_numeric_type(apVal[1]);

      /* It is an error to write an fts5_locale() value to a table without
      ** the locale=1 option. */
      if( pConfig->bLocale==0 ){
        int ii;
        for(ii=0; ii<pConfig->nCol; ii++){
          sqlite3_value *pVal = apVal[ii+2];
          if( sqlite3Fts5IsLocaleValue(pConfig, pVal) ){
            fts5SetVtabError(pTab, "fts5_locale() requires locale=1");
            rc = SQLITE_MISMATCH;
            goto update_out;
          }
        }
      }

      if( eType0!=SQLITE_INTEGER ){
        /* An INSERT statement. If the conflict-mode is REPLACE, first remove
        ** the current entry (if any). */
        if( eConflict==SQLITE_REPLACE && eType1==SQLITE_INTEGER ){
          i64 iNew = sqlite3_value_int64(apVal[1]);  /* Rowid to delete */
          rc = sqlite3Fts5StorageDelete(pTab->pStorage, iNew, 0, 0);
        }
        fts5StorageInsert(&rc, pTab, apVal, pRowid);
      }

      /* UPDATE */
      else{
        Fts5Storage *pStorage = pTab->pStorage;
        i64 iOld = sqlite3_value_int64(apVal[0]);  /* Old rowid */
        i64 iNew = sqlite3_value_int64(apVal[1]);  /* New rowid */
        int bContent = 0;         /* Content only update */

        /* If this is a contentless table (including contentless_unindexed=1
        ** tables), check if the UPDATE may proceed.  */
        if( fts5IsContentless(pTab, 1) ){
          rc = fts5ContentlessUpdate(pConfig, &apVal[2], iOld!=iNew, &bContent);
          if( rc!=SQLITE_OK ) goto update_out;
        }

        if( eType1!=SQLITE_INTEGER ){
          rc = SQLITE_MISMATCH;
        }else if( iOld!=iNew ){
          assert( bContent==0 );
          if( eConflict==SQLITE_REPLACE ){
            rc = sqlite3Fts5StorageDelete(pStorage, iOld, 0, 1);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pStorage, iNew, 0, 0);
            }
            fts5StorageInsert(&rc, pTab, apVal, pRowid);
          }else{
            rc = sqlite3Fts5StorageFindDeleteRow(pStorage, iOld);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageContentInsert(pStorage, 0, apVal, pRowid);
            }
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pStorage, iOld, 0, 0);
            }
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageIndexInsert(pStorage, apVal, *pRowid);
            }
          }
        }else if( bContent ){
          /* This occurs when an UPDATE on a contentless table affects *only*
          ** UNINDEXED columns. This is a no-op for contentless_unindexed=0
          ** tables, or a write to the %_content table only for =1 tables.  */
          assert( fts5IsContentless(pTab, 1) );
          rc = sqlite3Fts5StorageFindDeleteRow(pStorage, iOld);
          if( rc==SQLITE_OK ){
            rc = sqlite3Fts5StorageContentInsert(pStorage, 1, apVal, pRowid);
          }
        }else{
          rc = sqlite3Fts5StorageDelete(pStorage, iOld, 0, 1);
          fts5StorageInsert(&rc, pTab, apVal, pRowid);
        }
        sqlite3Fts5StorageReleaseDeleteRow(pStorage);
      }
    }
  }

 update_out:
  pTab->p.pConfig->pzErrmsg = 0;
  return rc;
}